

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O2

Uint32 anon_unknown.dwarf_7de29::equationToGlConstant(Equation blendEquation)

{
  ostream *poVar1;
  
  if (blendEquation < (ReverseSubtract|Subtract)) {
    return *(Uint32 *)(&DAT_00144e28 + (ulong)blendEquation * 4);
  }
  poVar1 = sf::err();
  poVar1 = std::operator<<(poVar1,
                           "Invalid value for sf::BlendMode::Equation! Fallback to sf::BlendMode::Add."
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderTarget.cpp"
                ,0x77,
                "sf::Uint32 (anonymous namespace)::equationToGlConstant(sf::BlendMode::Equation)");
}

Assistant:

sf::Uint32 equationToGlConstant(sf::BlendMode::Equation blendEquation)
    {
        switch (blendEquation)
        {
            case sf::BlendMode::Add:             return GLEXT_GL_FUNC_ADD;
            case sf::BlendMode::Subtract:        return GLEXT_GL_FUNC_SUBTRACT;
            case sf::BlendMode::ReverseSubtract: return GLEXT_GL_FUNC_REVERSE_SUBTRACT;
        }

        sf::err() << "Invalid value for sf::BlendMode::Equation! Fallback to sf::BlendMode::Add." << std::endl;
        assert(false);
        return GLEXT_GL_FUNC_ADD;
    }